

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O1

int nni_listener_getopt(nni_listener *l,char *name,void *val,size_t *szp,nni_type t)

{
  _func_int_void_ptr_char_ptr_void_ptr_size_t_ptr_nni_type *p_Var1;
  nni_option *pnVar2;
  char *__s1;
  int iVar3;
  
  p_Var1 = (l->l_ops).l_getopt;
  if ((p_Var1 != (_func_int_void_ptr_char_ptr_void_ptr_size_t_ptr_nni_type *)0x0) &&
     (iVar3 = (*p_Var1)(l->l_data,name,val,szp,t), iVar3 != 9)) {
    return iVar3;
  }
  pnVar2 = (l->l_ops).l_options;
  if (pnVar2 != (nni_option *)0x0) {
    __s1 = pnVar2->o_name;
    while (__s1 != (char *)0x0) {
      iVar3 = strcmp(__s1,name);
      if (iVar3 == 0) {
        if (pnVar2->o_get == (_func_int_void_ptr_void_ptr_size_t_ptr_nni_type *)0x0) {
          return 0x19;
        }
        iVar3 = (*pnVar2->o_get)(l->l_data,val,szp,t);
        return iVar3;
      }
      __s1 = pnVar2[1].o_name;
      pnVar2 = pnVar2 + 1;
    }
  }
  iVar3 = nni_sock_getopt(l->l_sock,name,val,szp,t);
  return iVar3;
}

Assistant:

int
nni_listener_getopt(
    nni_listener *l, const char *name, void *val, size_t *szp, nni_type t)
{
	nni_option *o;

	if (l->l_ops.l_getopt != NULL) {
		int rv = l->l_ops.l_getopt(l->l_data, name, val, szp, t);
		if (rv != NNG_ENOTSUP) {
			return (rv);
		}
	}

	for (o = l->l_ops.l_options; o && o->o_name; o++) {
		if (strcmp(o->o_name, name) != 0) {
			continue;
		}
		if (o->o_get == NULL) {
			return (NNG_EWRITEONLY);
		}
		return (o->o_get(l->l_data, val, szp, t));
	}

	return (nni_sock_getopt(l->l_sock, name, val, szp, t));
}